

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer_on_shmem.cpp
# Opt level: O2

int64_t __thiscall
SharedMemRingBuffer::WaitFor(SharedMemRingBuffer *this,size_t user_id,int64_t index)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  
  lVar1 = (this->ring_buffer_status_on_shared_mem_->cursor).super___atomic_base<long>._M_i;
  if (lVar1 < index) {
    iVar2 = (*this->wait_strategy_->_vptr_WaitStrategyInterface[2])(this->wait_strategy_,index);
    return CONCAT44(extraout_var,iVar2);
  }
  return lVar1;
}

Assistant:

int64_t SharedMemRingBuffer::WaitFor(size_t user_id, int64_t index)
{
    int64_t current_cursor = ring_buffer_status_on_shared_mem_->cursor.load() ;

    if( index > current_cursor ) {
        
#if 0
        char szMsg[100];
        snprintf(szMsg, sizeof(szMsg), 
                "[id:%d]    \t\t\t\t\t\t\t\t\t\t\t\t[%s-%d] index [%" PRId64 " - trans : %" PRId64 "] no data, wait for :current_cursor[%" PRId64 "]", 
                user_id, __func__, __LINE__, index, GetTranslatedIndex(index),current_cursor  );
        {AtomicPrint atomicPrint(szMsg);}
#endif
        //wait strategy
        return wait_strategy_->Wait(index);
    } else {
#if 0
        char szMsg[100];
        snprintf(szMsg, sizeof(szMsg), "[id:%d]    \t\t\t\t\t\t\t\t\t\t\t\t [%s-%d] index[%" PRId64 "] returns [%" PRId64 "] ",
                user_id, __func__, __LINE__, index, ring_buffer_status_on_shared_mem_->cursor.load() );
        {AtomicPrint atomicPrint(szMsg);}
#endif
        return current_cursor ;
    }
    return 0;
}